

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testInvalidLoop1(void)

{
  RepeatedField<long> *this;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  Rep *pRVar4;
  ulong uVar5;
  ConvolutionLayerParams *pCVar6;
  TypeUnion TVar7;
  bool bVar8;
  FeatureType *pFVar9;
  ArrayFeatureType *pAVar10;
  long *plVar11;
  FeatureDescription *pFVar12;
  ActivationParams *pAVar13;
  ActivationReLU *pAVar14;
  LoopLayerParams *pLVar15;
  NeuralNetwork *pNVar16;
  NeuralNetworkLayer *pNVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar18;
  void *pvVar19;
  CopyLayerParams *pCVar20;
  ostream *poVar21;
  long lVar22;
  undefined8 *puVar23;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar24;
  Arena *pAVar25;
  Model m;
  Result res;
  NeuralNetwork nnBody;
  Model MStack_c8;
  Result local_98;
  NeuralNetwork local_70;
  
  CoreML::Specification::Model::Model(&MStack_c8,(Arena *)0x0,false);
  if (MStack_c8.description_ == (ModelDescription *)0x0) {
    pAVar25 = (Arena *)(MStack_c8.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_c8.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar25 = *(Arena **)pAVar25;
    }
    MStack_c8.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar25);
  }
  pRVar4 = ((MStack_c8.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001ac156:
    pRVar24 = &(MStack_c8.description_)->input_;
    pFVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar24->super_RepeatedPtrFieldBase).arena_);
    pvVar19 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar24->super_RepeatedPtrFieldBase,pFVar12);
  }
  else {
    iVar1 = ((MStack_c8.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001ac156;
    ((MStack_c8.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar19 = pRVar4->elements[iVar1];
  }
  puVar23 = (undefined8 *)(*(ulong *)((long)pvVar19 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar19 + 8) & 1) != 0) {
    puVar23 = (undefined8 *)*puVar23;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar19 + 0x10),"A",puVar23);
  if (*(long *)((long)pvVar19 + 0x20) == 0) {
    pAVar25 = (Arena *)(*(ulong *)((long)pvVar19 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar19 + 8) & 1) != 0) {
      pAVar25 = *(Arena **)pAVar25;
    }
    pFVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar25);
    *(FeatureType **)((long)pvVar19 + 0x20) = pFVar9;
  }
  pFVar9 = *(FeatureType **)((long)pvVar19 + 0x20);
  if (pFVar9->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar9);
    pFVar9->_oneof_case_[0] = 5;
    uVar5 = (pFVar9->super_MessageLite)._internal_metadata_.ptr_;
    pAVar25 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar25 = *(Arena **)pAVar25;
    }
    pAVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                        (pAVar25);
    (pFVar9->Type_).multiarraytype_ = pAVar10;
  }
  if (*(long *)((long)pvVar19 + 0x20) == 0) {
    pAVar25 = (Arena *)(*(ulong *)((long)pvVar19 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar19 + 8) & 1) != 0) {
      pAVar25 = *(Arena **)pAVar25;
    }
    pFVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar25);
    *(FeatureType **)((long)pvVar19 + 0x20) = pFVar9;
  }
  pFVar9 = *(FeatureType **)((long)pvVar19 + 0x20);
  if (pFVar9->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar9);
    pFVar9->_oneof_case_[0] = 5;
    uVar5 = (pFVar9->super_MessageLite)._internal_metadata_.ptr_;
    pAVar25 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar25 = *(Arena **)pAVar25;
    }
    pAVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                        (pAVar25);
    (pFVar9->Type_).multiarraytype_ = pAVar10;
  }
  pAVar10 = (pFVar9->Type_).multiarraytype_;
  this = &pAVar10->shape_;
  uVar2 = (pAVar10->shape_).current_size_;
  uVar3 = (pAVar10->shape_).total_size_;
  if (uVar2 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar3 + 1);
  }
  plVar11 = google::protobuf::RepeatedField<long>::elements(this);
  plVar11[uVar2] = 1;
  this->current_size_ = uVar2 + 1;
  if (MStack_c8.description_ == (ModelDescription *)0x0) {
    pAVar25 = (Arena *)(MStack_c8.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_c8.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar25 = *(Arena **)pAVar25;
    }
    MStack_c8.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar25);
  }
  pRVar4 = ((MStack_c8.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001ac2c2:
    pRVar24 = &(MStack_c8.description_)->output_;
    pFVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar24->super_RepeatedPtrFieldBase).arena_);
    pvVar19 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar24->super_RepeatedPtrFieldBase,pFVar12);
  }
  else {
    iVar1 = ((MStack_c8.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001ac2c2;
    ((MStack_c8.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar19 = pRVar4->elements[iVar1];
  }
  puVar23 = (undefined8 *)(*(ulong *)((long)pvVar19 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar19 + 8) & 1) != 0) {
    puVar23 = (undefined8 *)*puVar23;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar19 + 0x10),"B",puVar23);
  if (*(long *)((long)pvVar19 + 0x20) == 0) {
    pAVar25 = (Arena *)(*(ulong *)((long)pvVar19 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar19 + 8) & 1) != 0) {
      pAVar25 = *(Arena **)pAVar25;
    }
    pFVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar25);
    *(FeatureType **)((long)pvVar19 + 0x20) = pFVar9;
  }
  pFVar9 = *(FeatureType **)((long)pvVar19 + 0x20);
  if (pFVar9->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar9);
    pFVar9->_oneof_case_[0] = 5;
    uVar5 = (pFVar9->super_MessageLite)._internal_metadata_.ptr_;
    pAVar25 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar25 = *(Arena **)pAVar25;
    }
    pAVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                        (pAVar25);
    (pFVar9->Type_).multiarraytype_ = pAVar10;
  }
  CoreML::Specification::NeuralNetwork::NeuralNetwork(&local_70,(Arena *)0x0,false);
  if (local_70.layers_.super_RepeatedPtrFieldBase.rep_ == (Rep *)0x0) {
LAB_001ac386:
    pNVar17 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        (local_70.layers_.super_RepeatedPtrFieldBase.arena_);
    pNVar17 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&local_70.layers_.super_RepeatedPtrFieldBase,pNVar17);
  }
  else {
    lVar22 = (long)local_70.layers_.super_RepeatedPtrFieldBase.current_size_;
    if ((local_70.layers_.super_RepeatedPtrFieldBase.rep_)->allocated_size <=
        local_70.layers_.super_RepeatedPtrFieldBase.current_size_) goto LAB_001ac386;
    local_70.layers_.super_RepeatedPtrFieldBase.current_size_ =
         local_70.layers_.super_RepeatedPtrFieldBase.current_size_ + 1;
    pNVar17 = (NeuralNetworkLayer *)
              (local_70.layers_.super_RepeatedPtrFieldBase.rep_)->elements[lVar22];
  }
  if (pNVar17->_oneof_case_[0] != 0x82) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar17);
    pNVar17->_oneof_case_[0] = 0x82;
    uVar5 = (pNVar17->super_MessageLite)._internal_metadata_.ptr_;
    pAVar25 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar25 = *(Arena **)pAVar25;
    }
    pAVar13 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ActivationParams>
                        (pAVar25);
    (pNVar17->layer_).activation_ = pAVar13;
  }
  pAVar13 = (pNVar17->layer_).activation_;
  if (pAVar13->_oneof_case_[0] != 10) {
    CoreML::Specification::ActivationParams::clear_NonlinearityType(pAVar13);
    pAVar13->_oneof_case_[0] = 10;
    uVar5 = (pAVar13->super_MessageLite)._internal_metadata_.ptr_;
    pAVar25 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar25 = *(Arena **)pAVar25;
    }
    pAVar14 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ActivationReLU>
                        (pAVar25);
    (pAVar13->NonlinearityType_).relu_ = pAVar14;
  }
  uVar5 = (pNVar17->super_MessageLite)._internal_metadata_.ptr_;
  puVar23 = (undefined8 *)(uVar5 & 0xfffffffffffffffc);
  if ((uVar5 & 1) != 0) {
    puVar23 = (undefined8 *)*puVar23;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pNVar17->name_,"relu",puVar23);
  pRVar4 = (pNVar17->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001ac458:
    pbVar18 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar17->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar19 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar17->input_).super_RepeatedPtrFieldBase,pbVar18);
  }
  else {
    iVar1 = (pNVar17->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001ac458;
    (pNVar17->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar19 = pRVar4->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar19,0,*(char **)((long)pvVar19 + 8),0x3b8534);
  pRVar4 = (pNVar17->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001ac4a8:
    pbVar18 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar17->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar19 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar17->output_).super_RepeatedPtrFieldBase,pbVar18);
  }
  else {
    iVar1 = (pNVar17->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001ac4a8;
    (pNVar17->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar19 = pRVar4->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar19,0,*(char **)((long)pvVar19 + 8),0x3d8b56);
  if (MStack_c8._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&MStack_c8);
    MStack_c8._oneof_case_[0] = 500;
    pAVar25 = (Arena *)(MStack_c8.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_c8.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar25 = *(Arena **)pAVar25;
    }
    MStack_c8.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar25);
  }
  TVar7 = MStack_c8.Type_;
  (MStack_c8.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  this_00 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(MStack_c8.Type_.pipeline_)->models_;
  pRVar4 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(MStack_c8.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001ac542:
    pNVar17 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_00->super_RepeatedPtrFieldBase).arena_);
    pNVar17 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_00,pNVar17);
  }
  else {
    iVar1 = (MStack_c8.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001ac542;
    (MStack_c8.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar1 + 1;
    pNVar17 = (NeuralNetworkLayer *)pRVar4->elements[iVar1];
  }
  uVar5 = (pNVar17->super_MessageLite)._internal_metadata_.ptr_;
  puVar23 = (undefined8 *)(uVar5 & 0xfffffffffffffffc);
  if ((uVar5 & 1) != 0) {
    puVar23 = (undefined8 *)*puVar23;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pNVar17->name_,"for_loop",puVar23);
  if (pNVar17->_oneof_case_[0] != 0x267) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar17);
    pNVar17->_oneof_case_[0] = 0x267;
    uVar5 = (pNVar17->super_MessageLite)._internal_metadata_.ptr_;
    pAVar25 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar25 = *(Arena **)pAVar25;
    }
    pLVar15 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::LoopLayerParams>
                        (pAVar25);
    (pNVar17->layer_).loop_ = pLVar15;
  }
  pCVar6 = (pNVar17->layer_).convolution_;
  if (*(long *)&pCVar6->_kernelsize_cached_byte_size_ == 0) {
    uVar5 = (pCVar6->super_MessageLite)._internal_metadata_.ptr_;
    pAVar25 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar25 = *(Arena **)pAVar25;
    }
    pNVar16 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>
                        (pAVar25);
    *(NeuralNetwork **)&pCVar6->_kernelsize_cached_byte_size_ = pNVar16;
  }
  CoreML::Specification::NeuralNetwork::CopyFrom
            (*(NeuralNetwork **)&pCVar6->_kernelsize_cached_byte_size_,&local_70);
  pRVar4 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(TVar7.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001ac611:
    pNVar17 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_00->super_RepeatedPtrFieldBase).arena_);
    pNVar17 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_00,pNVar17);
  }
  else {
    iVar1 = (TVar7.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001ac611;
    (TVar7.treeensembleregressor_)->postevaluationtransform_ = iVar1 + 1;
    pNVar17 = (NeuralNetworkLayer *)pRVar4->elements[iVar1];
  }
  uVar5 = (pNVar17->super_MessageLite)._internal_metadata_.ptr_;
  puVar23 = (undefined8 *)(uVar5 & 0xfffffffffffffffc);
  if ((uVar5 & 1) != 0) {
    puVar23 = (undefined8 *)*puVar23;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pNVar17->name_,"copy",puVar23);
  pRVar4 = (pNVar17->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001ac668:
    pbVar18 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar17->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar19 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar17->input_).super_RepeatedPtrFieldBase,pbVar18);
  }
  else {
    iVar1 = (pNVar17->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001ac668;
    (pNVar17->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar19 = pRVar4->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar19,0,*(char **)((long)pvVar19 + 8),0x3b8534);
  pRVar4 = (pNVar17->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 != (Rep *)0x0) {
    iVar1 = (pNVar17->output_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar1 < pRVar4->allocated_size) {
      (pNVar17->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      pvVar19 = pRVar4->elements[iVar1];
      goto LAB_001ac6d2;
    }
  }
  pbVar18 = google::protobuf::Arena::Create<std::__cxx11::string>
                      ((pNVar17->output_).super_RepeatedPtrFieldBase.arena_);
  pvVar19 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pNVar17->output_).super_RepeatedPtrFieldBase,pbVar18);
LAB_001ac6d2:
  std::__cxx11::string::_M_replace((ulong)pvVar19,0,*(char **)((long)pvVar19 + 8),0x3d8b56);
  if (pNVar17->_oneof_case_[0] != 600) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar17);
    pNVar17->_oneof_case_[0] = 600;
    uVar5 = (pNVar17->super_MessageLite)._internal_metadata_.ptr_;
    pAVar25 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar25 = *(Arena **)pAVar25;
    }
    pCVar20 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::CopyLayerParams>
                        (pAVar25);
    (pNVar17->layer_).copy_ = pCVar20;
  }
  CoreML::validate<(MLModelType)500>(&local_98,&MStack_c8);
  bVar8 = CoreML::Result::good(&local_98);
  if (bVar8) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar21 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x11b1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar21,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar21,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar21," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar21 + -0x18) + (char)poVar21);
    std::ostream::put((char)poVar21);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.m_message._M_dataplus._M_p != &local_98.m_message.field_2) {
    operator_delete(local_98.m_message._M_dataplus._M_p,
                    local_98.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::NeuralNetwork::~NeuralNetwork(&local_70);
  CoreML::Specification::Model::~Model(&MStack_c8);
  return (uint)bVar8;
}

Assistant:

int testInvalidLoop1() {
    /*
     no input, no condition network, 0 max loop
     */
    Specification::Model m;
    auto *topIn = m.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    auto *out = m.mutable_description()->add_output();
    out->set_name("B");
    out->mutable_type()->mutable_multiarraytype();


    Specification::NeuralNetwork nnBody;
    auto *l1 = nnBody.add_layers();
    (void)l1->mutable_activation()->mutable_relu();
    l1->set_name("relu");
    l1->add_input("A");
    l1->add_output("B");

    auto *nnMain = m.mutable_neuralnetwork();
    nnMain->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);
    auto *l2 = nnMain->add_layers();
    l2->set_name("for_loop");
    auto *loop_params = l2->mutable_loop();
    loop_params->mutable_bodynetwork()->CopyFrom(nnBody);

    auto *l3 = nnMain->add_layers();
    l3->set_name("copy");
    l3->add_input("A");
    l3->add_output("B");
    (void) l3->mutable_copy();

    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    return 0;
}